

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyHttpImplPrivate::replyDownloadData(QNetworkReplyHttpImplPrivate *this,QByteArray *d)

{
  QByteArrayView value;
  bool bVar1;
  int iVar2;
  QNetworkReplyHttpImpl *__u;
  ulong uVar3;
  qsizetype qVar4;
  qint64 qVar5;
  qsizetype qVar6;
  QNetworkReplyHttpImplPrivate *__nbytes;
  char *pcVar7;
  ssize_t sVar8;
  long lVar9;
  QNetworkReplyHttpImplPrivate *in_RSI;
  QNetworkReplyHttpImplPrivate *in_RDI;
  long in_FS_OFFSET;
  optional<long_long> oVar10;
  int pendingSignals;
  quint64 nextSize;
  qint64 bytesRead;
  qsizetype increments;
  qint64 uncompressedBefore;
  qsizetype dataSize;
  QNetworkReplyHttpImpl *q;
  optional<long_long> totalSizeOpt;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  QNetworkReplyHttpImplPrivate *in_stack_fffffffffffffe70;
  QString *in_stack_fffffffffffffe78;
  optional<long_long> *this_00;
  QDecompressHelper *in_stack_fffffffffffffe80;
  NetworkError NVar11;
  WellKnownHeader name;
  QNetworkReplyHttpImplPrivate *in_stack_fffffffffffffe88;
  QByteArrayView in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffeb8;
  QChar QVar13;
  QNetworkReplyHttpImplPrivate *pQVar12;
  long local_140;
  long local_130;
  QByteArrayView local_100;
  QChar local_e2 [13];
  char local_c8 [48];
  char local_98 [54];
  QChar local_62 [13];
  char local_48 [48];
  _Storage<long_long,_true> local_18;
  undefined8 local_10;
  long local_8;
  
  QVar13.ucs = (char16_t)((ulong)in_stack_fffffffffffffeb8 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __u = q_func(in_RDI);
  uVar3 = QIODevice::isOpen();
  if ((uVar3 & 1) == 0) goto LAB_0031c258;
  qVar4 = QByteArray::size((QByteArray *)in_RSI);
  if ((((in_RDI->cacheEnabled & 1U) != 0) && (bVar1 = isCachingAllowed(in_RDI), bVar1)) &&
     (in_RDI->cacheSaveDevice == (QIODevice *)0x0)) {
    initCacheSaveDevice(in_RSI);
  }
  bVar1 = QDecompressHelper::isValid(&in_RDI->decompressHelper);
  if (bVar1) {
    local_130 = -1;
    bVar1 = QDecompressHelper::isCountingBytes(&in_RDI->decompressHelper);
    if (bVar1) {
      local_130 = QDecompressHelper::uncompressedSize(in_stack_fffffffffffffe80);
    }
    QDecompressHelper::feed
              ((QDecompressHelper *)in_stack_fffffffffffffe70,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    bVar1 = QDecompressHelper::isValid(&in_RDI->decompressHelper);
    if (!bVar1) {
      QCoreApplication::translate(local_48,"QHttp","Decompression failed: %1",0);
      NVar11 = (NetworkError)((ulong)in_stack_fffffffffffffe80 >> 0x20);
      QDecompressHelper::errorString
                ((QDecompressHelper *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
      ;
      QChar::QChar<char16_t,_true>(local_62,L' ');
      QString::arg<QString,_true>
                ((QString *)in_RSI,(QString *)in_stack_fffffffffffffe88,NVar11,QVar13);
      error(in_stack_fffffffffffffe88,NVar11,in_stack_fffffffffffffe78);
      QString::~QString((QString *)0x31bcdf);
      QString::~QString((QString *)0x31bcec);
      QString::~QString((QString *)0x31bcf9);
      QDecompressHelper::clear((QDecompressHelper *)in_RSI);
      goto LAB_0031c258;
    }
    bVar1 = isHttpRedirectResponse(in_stack_fffffffffffffe70);
    if (!bVar1) {
      bVar1 = QDecompressHelper::isCountingBytes(&in_RDI->decompressHelper);
      if (bVar1) {
        qVar5 = QDecompressHelper::uncompressedSize(in_stack_fffffffffffffe80);
        in_RDI->bytesDownloaded = (qVar5 - local_130) + in_RDI->bytesDownloaded;
      }
      setupTransferTimeout(in_RSI);
    }
    if ((in_RDI->synchronous & 1U) != 0) {
      QByteArray::QByteArray((QByteArray *)0x31bd89);
      QByteArray::operator=
                ((QByteArray *)in_stack_fffffffffffffe70,
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      QByteArray::~QByteArray((QByteArray *)0x31bda8);
      local_140 = 0;
      do {
        bVar1 = QDecompressHelper::hasData((QDecompressHelper *)in_stack_fffffffffffffe70);
        NVar11 = (NetworkError)((ulong)in_stack_fffffffffffffe80 >> 0x20);
        if (!bVar1) {
          QByteArray::resize((longlong)in_RSI);
          QDecompressHelper::clear((QDecompressHelper *)in_RSI);
          goto LAB_0031bfba;
        }
        qVar6 = QByteArray::size((QByteArray *)in_RSI);
        in_stack_fffffffffffffe88 = (QNetworkReplyHttpImplPrivate *)(qVar6 + 0x4000);
        pQVar12 = in_stack_fffffffffffffe88;
        __nbytes = (QNetworkReplyHttpImplPrivate *)std::numeric_limits<long_long>::max();
        QVar13.ucs = (char16_t)((ulong)pQVar12 >> 0x30);
        if (__nbytes < in_stack_fffffffffffffe88) {
          QCoreApplication::translate(local_98,"QHttp","Data downloaded is too large to store",0);
          error(in_stack_fffffffffffffe88,NVar11,in_stack_fffffffffffffe78);
          QString::~QString((QString *)0x31be4e);
          QDecompressHelper::clear((QDecompressHelper *)in_RSI);
          goto LAB_0031c258;
        }
        QByteArray::resize((longlong)in_RSI);
        in_stack_fffffffffffffe80 = &in_RDI->decompressHelper;
        pcVar7 = QByteArray::data((QByteArray *)in_stack_fffffffffffffe70);
        sVar8 = QDecompressHelper::read
                          (in_stack_fffffffffffffe80,(int)pcVar7 + (int)local_140,(void *)0x4000,
                           (size_t)__nbytes);
        local_140 = sVar8 + local_140;
        bVar1 = QDecompressHelper::isValid(&in_RDI->decompressHelper);
        NVar11 = (NetworkError)((ulong)in_stack_fffffffffffffe80 >> 0x20);
      } while (bVar1);
      QCoreApplication::translate(local_c8,"QHttp","Decompression failed: %1",0);
      QDecompressHelper::errorString
                ((QDecompressHelper *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
      ;
      QChar::QChar<char16_t,_true>(local_e2,L' ');
      QString::arg<QString,_true>
                ((QString *)in_RSI,(QString *)in_stack_fffffffffffffe88,NVar11,QVar13);
      error(in_stack_fffffffffffffe88,NVar11,in_stack_fffffffffffffe78);
      QString::~QString((QString *)0x31bf63);
      QString::~QString((QString *)0x31bf70);
      QString::~QString((QString *)0x31bf7d);
      QDecompressHelper::clear((QDecompressHelper *)in_RSI);
      goto LAB_0031c258;
    }
  }
LAB_0031bfba:
  name = (WellKnownHeader)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  if ((in_RDI->cacheSaveDevice != (QIODevice *)0x0) &&
     (bVar1 = QDecompressHelper::isValid(&in_RDI->decompressHelper), !bVar1)) {
    QIODevice::write((QByteArray *)in_RDI->cacheSaveDevice);
  }
  bVar1 = QDecompressHelper::isValid(&in_RDI->decompressHelper);
  if ((!bVar1) && (bVar1 = isHttpRedirectResponse(in_stack_fffffffffffffe70), !bVar1)) {
    QIODevicePrivate::QRingBufferRef::append
              ((QRingBufferRef *)in_stack_fffffffffffffe70,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    in_RDI->bytesDownloaded = qVar4 + in_RDI->bytesDownloaded;
    setupTransferTimeout(in_RSI);
  }
  in_RDI->bytesBuffered = qVar4 + in_RDI->bytesBuffered;
  std::__shared_ptr_access<QAtomicInt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<QAtomicInt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x31c06e);
  iVar2 = QBasicAtomicInteger<int>::fetchAndSubAcquire
                    ((QBasicAtomicInteger<int> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c
                    );
  if ((iVar2 + -1 < 1) && (bVar1 = isHttpRedirectResponse(in_stack_fffffffffffffe70), !bVar1)) {
    if (in_RDI->lastReadyReadEmittedSize == in_RDI->bytesDownloaded) {
      if ((in_RDI->super_QNetworkReplyPrivate).readBufferMaxSize != 0) {
        QNetworkReplyHttpImpl::readBufferFreed
                  ((QNetworkReplyHttpImpl *)0x31c0d6,
                   CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      }
    }
    else {
      in_RDI->lastReadyReadEmittedSize = in_RDI->bytesDownloaded;
      local_18 = (_Storage<long_long,_true>)0xaaaaaaaaaaaaaaaa;
      local_10 = 0xaaaaaaaaaaaaaaaa;
      QNetworkHeadersPrivate::headers
                ((QNetworkHeadersPrivate *)
                 CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      QByteArrayView::QByteArrayView(&local_100);
      QHttpHeaders::value((QHttpHeaders *)in_stack_fffffffffffffe88,name,in_stack_fffffffffffffea0);
      value.m_data = (storage_type *)in_RDI;
      value.m_size = (qsizetype)in_RSI;
      oVar10 = QNetworkHeadersPrivate::toInt(value);
      local_18._M_value =
           oVar10.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long>._M_payload;
      local_10 = CONCAT71(local_10._1_7_,
                          oVar10.super__Optional_base<long_long,_true,_true>._M_payload.
                          super__Optional_payload_base<long_long>._M_engaged);
      QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x31c184);
      QIODevice::readyRead();
      uVar3 = QElapsedTimer::isValid();
      if ((((uVar3 & 1) != 0) && (lVar9 = QElapsedTimer::elapsed(), 99 < lVar9)) &&
         ((bVar1 = QDecompressHelper::isValid(&in_RDI->decompressHelper), !bVar1 ||
          (bVar1 = QDecompressHelper::isCountingBytes(&in_RDI->decompressHelper), bVar1)))) {
        QElapsedTimer::start();
        this_00 = (optional<long_long> *)in_RDI->bytesDownloaded;
        std::optional<long_long>::value_or<int>(this_00,(int *)__u);
        QNetworkReply::downloadProgress
                  ((QNetworkReply *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                   (qint64)this_00,(qint64)__u);
      }
    }
  }
LAB_0031c258:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyHttpImplPrivate::replyDownloadData(QByteArray d)
{
    Q_Q(QNetworkReplyHttpImpl);

    // If we're closed just ignore this data
    if (!q->isOpen())
        return;

    // cache this, we need it later and it's invalidated when dealing with compressed data
    auto dataSize = d.size();

    if (cacheEnabled && isCachingAllowed() && !cacheSaveDevice)
        initCacheSaveDevice();

    if (decompressHelper.isValid()) {
        qint64 uncompressedBefore = -1;
        if (decompressHelper.isCountingBytes())
            uncompressedBefore = decompressHelper.uncompressedSize();

        decompressHelper.feed(std::move(d));

        if (!decompressHelper.isValid()) {
            error(QNetworkReplyImpl::NetworkError::UnknownContentError,
                  QCoreApplication::translate("QHttp", "Decompression failed: %1")
                          .arg(decompressHelper.errorString()));
            decompressHelper.clear();
            return;
        }

        if (!isHttpRedirectResponse()) {
            if (decompressHelper.isCountingBytes())
                bytesDownloaded += (decompressHelper.uncompressedSize() - uncompressedBefore);
            setupTransferTimeout();
        }

        if (synchronous) {
            d = QByteArray();
            const qsizetype increments = 16 * 1024;
            qint64 bytesRead = 0;
            while (decompressHelper.hasData()) {
                quint64 nextSize = quint64(d.size()) + quint64(increments);
                if (nextSize > quint64(std::numeric_limits<QByteArray::size_type>::max())) {
                    error(QNetworkReplyImpl::NetworkError::UnknownContentError,
                          QCoreApplication::translate("QHttp",
                                                      "Data downloaded is too large to store"));
                    decompressHelper.clear();
                    return;
                }
                d.resize(nextSize);
                bytesRead += decompressHelper.read(d.data() + bytesRead, increments);
                if (!decompressHelper.isValid()) {
                    error(QNetworkReplyImpl::NetworkError::UnknownContentError,
                          QCoreApplication::translate("QHttp", "Decompression failed: %1")
                                  .arg(decompressHelper.errorString()));
                    decompressHelper.clear();
                    return;
                }
            }
            d.resize(bytesRead);
            // we're synchronous so we're not calling this function again; reset the decompressHelper
            decompressHelper.clear();
        }
    }

    // This is going to look a little strange. When downloading data while a
    // HTTP redirect is happening (and enabled), we write the redirect
    // response to the cache. However, we do not append it to our internal
    // buffer as that will contain the response data only for the final
    // response
    // Note: For compressed data this is done in readData()
    if (cacheSaveDevice && !decompressHelper.isValid()) {
        cacheSaveDevice->write(d);
    }

    // if decompressHelper is valid then we have compressed data, and this is handled above
    if (!decompressHelper.isValid() && !isHttpRedirectResponse()) {
        buffer.append(d);
        bytesDownloaded += dataSize;
        setupTransferTimeout();
    }
    bytesBuffered += dataSize;

    int pendingSignals = pendingDownloadDataEmissions->fetchAndSubAcquire(1) - 1;
    if (pendingSignals > 0) {
        // Some more signal emissions to this slot are pending.
        // Instead of writing the downstream data, we wait
        // and do it in the next call we get
        // (signal comppression)
        return;
    }

    if (isHttpRedirectResponse())
        return;

    // This can occur when downloading compressed data as some of the data may be the content
    // encoding's header. Don't emit anything for this.
    if (lastReadyReadEmittedSize == bytesDownloaded) {
        if (readBufferMaxSize)
            emit q->readBufferFreed(dataSize);
        return;
    }
    lastReadyReadEmittedSize = bytesDownloaded;

    const auto totalSizeOpt = QNetworkHeadersPrivate::toInt(
            headers().value(QHttpHeaders::WellKnownHeader::ContentLength));

    emit q->readyRead();
    // emit readyRead before downloadProgress in case this will cause events to be
    // processed and we get into a recursive call (as in QProgressDialog).
    if (downloadProgressSignalChoke.isValid() &&
        downloadProgressSignalChoke.elapsed() >= progressSignalInterval
        && (!decompressHelper.isValid() || decompressHelper.isCountingBytes())) {
        downloadProgressSignalChoke.start();
        emit q->downloadProgress(bytesDownloaded, totalSizeOpt.value_or(-1));
    }
}